

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_deserialize_struct
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  t_struct *ptVar1;
  bool bVar2;
  ostream *poVar3;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  bVar2 = is_union_enabled(this);
  if ((bVar2) &&
     (bVar2 = t_struct::is_union((t_struct *)prefix_local), ptVar1 = tstruct_local, bVar2)) {
    t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_48);
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3," = await ");
    type_name_abi_cxx11_(&local_78,this,(t_type *)prefix_local,true);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    poVar3 = std::operator<<(poVar3,".ReadAsync(iprot, ");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    ptVar1 = tstruct_local;
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_98);
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3," = new ");
    type_name_abi_cxx11_(&local_b8,this,(t_type *)prefix_local,true);
    poVar3 = std::operator<<(poVar3,(string *)&local_b8);
    poVar3 = std::operator<<(poVar3,"();");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_d8);
    poVar3 = std::operator<<(poVar3,"await ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,".ReadAsync(iprot, ");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct, string prefix)
{
    if (is_union_enabled() && tstruct->is_union())
    {
        out << indent() << prefix << " = await " << type_name(tstruct) << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else
    {
        out << indent() << prefix << " = new " << type_name(tstruct) << "();" << endl
            << indent() << "await " << prefix << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
}